

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.cpp
# Opt level: O0

void jbcoin::openssl::serialize_ec_point(ec_point *point,uint8_t *ptr)

{
  int iVar1;
  pointer_t poVar2;
  EC_POINT *pub;
  int size;
  ec_key local_20;
  ec_key key;
  uint8_t *ptr_local;
  ec_point *point_local;
  
  key.ptr = (pointer_t)ptr;
  ec_key_new_secp256k1_compressed();
  poVar2 = ec_key::get(&local_20);
  pub = ec_point::get(point);
  iVar1 = EC_KEY_set_public_key((EC_KEY *)poVar2,(EC_POINT *)pub);
  if (iVar1 < 1) {
    Throw<std::runtime_error,char_const(&)[31]>((char (*) [31])"EC_KEY_set_public_key() failed");
  }
  poVar2 = ec_key::get(&local_20);
  iVar1 = i2o_ECPublicKey((EC_KEY *)poVar2,(uchar **)&key);
  if (iVar1 < 0x22) {
    ec_key::~ec_key(&local_20);
    return;
  }
  __assert_fail("size <= 33",
                "/workspace/llm4binary/github/license_all_cmakelists_25/trongnmchainos[P]validator-keys-tool/extras/jbcoin-libpp/extras/jbcoind/src/jbcoin/crypto/impl/openssl.cpp"
                ,0x7a,"void jbcoin::openssl::serialize_ec_point(const ec_point &, std::uint8_t *)");
}

Assistant:

void serialize_ec_point (ec_point const& point, std::uint8_t* ptr)
{
    ec_key key = ec_key_new_secp256k1_compressed();
    if (EC_KEY_set_public_key((EC_KEY*) key.get(), point.get()) <= 0)
        Throw<std::runtime_error> ("EC_KEY_set_public_key() failed");

    int const size = i2o_ECPublicKey ((EC_KEY*) key.get(), &ptr);

    assert (size <= 33);
    (void) size;
}